

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParserTest.cpp
# Opt level: O3

int PDFObjectParserTest(int argc,char **argv)

{
  string *psVar1;
  IReadPositionProvider *pIVar2;
  bool bVar3;
  RefCountPtr<PDFLiteralString> **ppRVar4;
  EStatusCode EVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  PDFObjectParser *this;
  PDFObject *pPVar9;
  long *plVar10;
  uint uVar11;
  ExpectedResult<PDFLiteralString> result;
  size_type __dnew;
  InputInterfaceToStream input;
  RefCountPtr<PDFObject> object;
  PDFObjectParserTestLogHelper log;
  PDFParser parser;
  FileURL local_7b8;
  string local_798;
  int local_778;
  int local_774;
  undefined1 local_770 [24];
  size_t local_758;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_750;
  PDFObject *local_740;
  undefined8 uStack_738;
  int local_72c;
  int local_728;
  int local_724;
  int local_720;
  allocator<char> local_719;
  string local_718;
  int local_6f8;
  int local_6f4;
  OutputFile local_6f0;
  string local_6c0;
  string local_6a0;
  PDFParser local_680;
  
  OutputFile::OutputFile(&local_6f0);
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"PDFObjectParserTest.txt","")
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,argv[2],&local_719);
  PosixPath::PosixPath((PosixPath *)&local_680,&local_718);
  PosixPath::ToFileURL((FileURL *)&local_798,(PosixPath *)&local_680);
  PosixPath::~PosixPath((PosixPath *)&local_680);
  FileURL::FileURL(&local_7b8,&local_6c0);
  FileURL::InterpretFrom((FileURL *)local_770,&local_7b8,(FileURL *)&local_798);
  PosixPath::PosixPath((PosixPath *)&local_680);
  PosixPath::FromFileURL((PosixPath *)&local_680,(FileURL *)local_770);
  PosixPath::ToString_abi_cxx11_(&local_6a0,(PosixPath *)&local_680);
  PosixPath::~PosixPath((PosixPath *)&local_680);
  FileURL::~FileURL((FileURL *)local_770);
  FileURL::~FileURL(&local_7b8);
  FileURL::~FileURL((FileURL *)&local_798);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  EVar5 = OutputFile::OpenFile(&local_6f0,&local_6a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
  }
  if (EVar5 == eSuccess) {
    PDFParser::PDFParser(&local_680);
    this = PDFParser::GetObjectParser(&local_680);
    local_770._0_8_ = &PTR__InputInterfaceToStream_003a5b38;
    local_770._8_8_ = &PTR__InputInterfaceToStream_003a5b70;
    local_758 = 0;
    local_750._M_local_buf[0] = '\0';
    local_740 = (PDFObject *)0x0;
    uStack_738 = 0;
    local_718._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_003a5870;
    local_718._M_string_length = 0;
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x7628;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x61;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0x6c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x6125;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ = 0x6d;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._7_1_ = 0x69;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._0_2_ = 0x29;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x9;
    local_7b8._0_8_ = ppRVar4;
    local_770._16_8_ = &local_750;
    std::__cxx11::string::_M_assign((string *)(local_770 + 0x10));
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream
              (this,(IByteReader *)local_770,(IReadPositionProvider *)(local_770 + 8),false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFLiteralString>::ExpectedResult
              ((ExpectedResult<PDFLiteralString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = 'v';
    local_798.field_2._M_local_buf[1] = 'a';
    local_798.field_2._M_local_buf[2] = 'l';
    local_798.field_2._M_local_buf[3] = '%';
    local_798.field_2._M_local_buf[4] = 'a';
    local_798.field_2._M_local_buf[5] = 'm';
    local_798.field_2._M_local_buf[6] = 'i';
    local_798._M_string_length = (size_type)&DAT_00000007;
    local_798.field_2._M_local_buf[7] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_778 = ExpectedResult<PDFLiteralString>::setResult
                          ((ExpectedResult<PDFLiteralString> *)&local_7b8,
                           (string *)(local_770 + 0x10),&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFLiteralString>::~RefCountPtr((RefCountPtr<PDFLiteralString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    if (0 < local_778) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed tests in PDFObjectParserTest::ParseCommentedTokens: "
                 ,0x3b);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_778);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
    }
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_718);
    local_770._0_8_ = &PTR__InputInterfaceToStream_003a5b38;
    local_770._8_8_ = &PTR__InputInterfaceToStream_003a5b70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._16_8_ != &local_750) {
      operator_delete((void *)local_770._16_8_,
                      CONCAT71(local_750._M_allocated_capacity._1_7_,local_750._M_local_buf[0]) + 1)
      ;
    }
    local_774 = 0;
    bVar3 = 0 < local_778;
    psVar1 = (string *)(local_770 + 0x10);
    local_770._0_8_ = &PTR__InputInterfaceToStream_003a5b38;
    local_770._8_8_ = &PTR__InputInterfaceToStream_003a5b70;
    local_758 = 0;
    local_750._M_local_buf[0] = '\0';
    local_740 = (PDFObject *)0x0;
    uStack_738 = 0;
    local_718._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_003a5870;
    local_718._M_string_length = 0;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x3e3c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x2;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0;
    local_7b8._0_8_ = ppRVar4;
    local_770._16_8_ = &local_750;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_720 = CONCAT31(local_720._1_3_,bVar3);
    pIVar2 = (IReadPositionProvider *)(local_770 + 8);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&local_7b8,pPVar9);
    local_798._M_string_length = 0;
    local_798.field_2._M_local_buf[0] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_724 = ExpectedResult<PDFHexString>::setResult
                          ((ExpectedResult<PDFHexString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFHexString>::~RefCountPtr((RefCountPtr<PDFHexString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x203c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x20;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0x20;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x3e;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x5;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&local_7b8,pPVar9);
    local_798._M_string_length = 0;
    local_798.field_2._M_local_buf[0] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    iVar6 = ExpectedResult<PDFHexString>::setResult
                      ((ExpectedResult<PDFHexString> *)&local_7b8,psVar1,&local_798,
                       (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFHexString>::~RefCountPtr((RefCountPtr<PDFHexString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0xa3c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x3e;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x3;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&local_7b8,pPVar9);
    local_798._M_string_length = 0;
    local_798.field_2._M_local_buf[0] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_728 = ExpectedResult<PDFHexString>::setResult
                          ((ExpectedResult<PDFHexString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFHexString>::~RefCountPtr((RefCountPtr<PDFHexString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x203c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x34;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0x31;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x2020;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ = 0x20;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._7_1_ = 0x34;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._0_2_ = 0x3220;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._2_1_ = 0x20;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._3_1_ = 0x3e;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0xc;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._4_1_ = 0;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = 'A';
    local_798.field_2._M_local_buf[1] = 'B';
    local_798._M_string_length = 2;
    local_798.field_2._M_local_buf[2] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_72c = ExpectedResult<PDFHexString>::setResult
                          ((ExpectedResult<PDFHexString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFHexString>::~RefCountPtr((RefCountPtr<PDFHexString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x303c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x34;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0x30;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x3030;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ = 0x32;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._7_1_ = 0x30;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._0_2_ = 0x3e31;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0xa;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._2_1_ = 0;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = '\x04';
    local_798.field_2._M_local_buf[1] = '\0';
    local_798.field_2._M_local_buf[2] = '\x02';
    local_798.field_2._M_local_buf[3] = '\x01';
    local_798._M_string_length = 4;
    local_798.field_2._M_local_buf[4] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_6f4 = ExpectedResult<PDFHexString>::setResult
                          ((ExpectedResult<PDFHexString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFHexString>::~RefCountPtr((RefCountPtr<PDFHexString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x663c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x65;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0x66;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x3066;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ = 0x30;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._7_1_ = 0x34;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._0_2_ = 0x3031;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._2_1_ = 0x30;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._3_1_ = 0x34;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._4_1_ = 0x32;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._5_1_ = 0x3e;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0xe;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._6_1_ = 0;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = 'A';
    local_798.field_2._M_local_buf[1] = 'B';
    local_798._M_string_length = 2;
    local_798.field_2._M_local_buf[2] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_6f8 = ExpectedResult<PDFHexString>::setResult
                          ((ExpectedResult<PDFHexString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFHexString>::~RefCountPtr((RefCountPtr<PDFHexString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_798._M_dataplus._M_p = (pointer)0x14;
    local_7b8._0_8_ = ppRVar4;
    local_7b8._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_7b8,(ulong)&local_798);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = SUB82(local_798._M_dataplus._M_p,0);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ =
         (undefined1)((ulong)local_798._M_dataplus._M_p >> 0x10);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ =
         (undefined1)((ulong)local_798._M_dataplus._M_p >> 0x18);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ =
         (undefined2)((ulong)local_798._M_dataplus._M_p >> 0x20);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ =
         (undefined1)((ulong)local_798._M_dataplus._M_p >> 0x30);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._7_1_ =
         (undefined1)((ulong)local_798._M_dataplus._M_p >> 0x38);
    ((RefCountPtr<PDFHexString> *)local_7b8._0_8_)->_vptr_RefCountPtr =
         (_func_int **)0x662066206520663c;
    ((RefCountPtr<PDFHexString> *)local_7b8._0_8_)->mValue = (PDFHexString *)0x3031203430203020;
    *(undefined4 *)&((RefCountPtr<PDFHexString> *)(local_7b8._0_8_ + 0x10))->_vptr_RefCountPtr =
         0x3e323430;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_798._M_dataplus._M_p;
    local_798._M_dataplus._M_p
    [(long)&((RefCountPtr<PDFHexString> *)local_7b8._0_8_)->_vptr_RefCountPtr] = '\0';
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = 'A';
    local_798.field_2._M_local_buf[1] = 'B';
    local_798._M_string_length = 2;
    local_798.field_2._M_local_buf[2] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    iVar7 = ExpectedResult<PDFHexString>::setResult
                      ((ExpectedResult<PDFHexString> *)&local_7b8,psVar1,&local_798,
                       (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFHexString>::~RefCountPtr((RefCountPtr<PDFHexString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x353c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x3e;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x3;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream
              (this,(IByteReader *)local_770,(IReadPositionProvider *)(local_770 + 8),false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = 'P';
    local_798.field_2._M_local_buf[1] = '\0';
    local_798._M_string_length = (size_type)&DAT_00000001;
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    iVar8 = ExpectedResult<PDFHexString>::setResult
                      ((ExpectedResult<PDFHexString> *)&local_7b8,psVar1,&local_798,
                       (PDFObjectParserTestLogHelper *)&local_6f0);
    iVar8 = iVar6 + local_724 + local_728 + local_72c + local_6f4 + local_6f8 + iVar7 + iVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFHexString>::~RefCountPtr((RefCountPtr<PDFHexString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    if (0 < iVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed tests in PDFObjectParserTest::ParseHexStringTokens: "
                 ,0x3b);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
    }
    local_774 = CONCAT31((int3)((uint)local_774 >> 8),(undefined1)local_720);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_718);
    local_770._0_8_ = &PTR__InputInterfaceToStream_003a5b38;
    local_770._8_8_ = &PTR__InputInterfaceToStream_003a5b70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._16_8_ != &local_750) {
      operator_delete((void *)local_770._16_8_,
                      CONCAT71(local_750._M_allocated_capacity._1_7_,local_750._M_local_buf[0]) + 1)
      ;
    }
    if (0 < iVar8) {
      local_774 = (0 < local_778) + 1;
    }
    psVar1 = (string *)(local_770 + 0x10);
    local_770._0_8_ = &PTR__InputInterfaceToStream_003a5b38;
    local_770._8_8_ = &PTR__InputInterfaceToStream_003a5b70;
    local_758 = 0;
    local_750._M_local_buf[0] = '\0';
    local_740 = (PDFObject *)0x0;
    uStack_738 = 0;
    local_718._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_003a5870;
    local_718._M_string_length = 0;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x2928;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x2;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0;
    local_7b8._0_8_ = ppRVar4;
    local_770._16_8_ = &local_750;
    std::__cxx11::string::_M_assign((string *)psVar1);
    pIVar2 = (IReadPositionProvider *)(local_770 + 8);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFLiteralString>::ExpectedResult
              ((ExpectedResult<PDFLiteralString> *)&local_7b8,pPVar9);
    local_798._M_string_length = 0;
    local_798.field_2._M_local_buf[0] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_778 = ExpectedResult<PDFLiteralString>::setResult
                          ((ExpectedResult<PDFLiteralString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFLiteralString>::~RefCountPtr((RefCountPtr<PDFLiteralString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x2028;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x29;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x3;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFLiteralString>::ExpectedResult
              ((ExpectedResult<PDFLiteralString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = ' ';
    local_798.field_2._M_local_buf[1] = '\0';
    local_798._M_string_length = (size_type)&DAT_00000001;
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    iVar6 = ExpectedResult<PDFLiteralString>::setResult
                      ((ExpectedResult<PDFLiteralString> *)&local_7b8,psVar1,&local_798,
                       (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFLiteralString>::~RefCountPtr((RefCountPtr<PDFLiteralString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x2028;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 10;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0x20;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x29;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x5;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFLiteralString>::ExpectedResult
              ((ExpectedResult<PDFLiteralString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = ' ';
    local_798.field_2._M_local_buf[1] = '\n';
    local_798.field_2._M_local_buf[2] = ' ';
    local_798.field_2._M_local_buf[3] = '\0';
    local_798._M_string_length = 3;
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_720 = ExpectedResult<PDFLiteralString>::setResult
                          ((ExpectedResult<PDFLiteralString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFLiteralString>::~RefCountPtr((RefCountPtr<PDFLiteralString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x2028;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x5c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 10;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x2920;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x6;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ = 0;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFLiteralString>::ExpectedResult
              ((ExpectedResult<PDFLiteralString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = ' ';
    local_798.field_2._M_local_buf[1] = ' ';
    local_798._M_string_length = 2;
    local_798.field_2._M_local_buf[2] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_724 = ExpectedResult<PDFLiteralString>::setResult
                          ((ExpectedResult<PDFLiteralString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFLiteralString>::~RefCountPtr((RefCountPtr<PDFLiteralString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x2028;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x28;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0x20;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x2029;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ = 0x29;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&DAT_00000007;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._7_1_ = 0;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFLiteralString>::ExpectedResult
              ((ExpectedResult<PDFLiteralString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = ' ';
    local_798.field_2._M_local_buf[1] = '(';
    local_798.field_2._M_local_buf[2] = ' ';
    local_798.field_2._M_local_buf[3] = ')';
    local_798.field_2._M_local_buf[4] = ' ';
    local_798.field_2._M_local_buf[5] = '\0';
    local_798._M_string_length = 5;
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_728 = ExpectedResult<PDFLiteralString>::setResult
                          ((ExpectedResult<PDFLiteralString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFLiteralString>::~RefCountPtr((RefCountPtr<PDFLiteralString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x2028;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x5c;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0x28;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x5c20;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ = 0x29;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._7_1_ = 0x20;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._0_2_ = 0x29;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x9;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFLiteralString>::ExpectedResult
              ((ExpectedResult<PDFLiteralString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = ' ';
    local_798.field_2._M_local_buf[1] = '(';
    local_798.field_2._M_local_buf[2] = ' ';
    local_798.field_2._M_local_buf[3] = ')';
    local_798.field_2._M_local_buf[4] = ' ';
    local_798.field_2._M_local_buf[5] = '\0';
    local_798._M_string_length = 5;
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    local_72c = ExpectedResult<PDFLiteralString>::setResult
                          ((ExpectedResult<PDFLiteralString> *)&local_7b8,psVar1,&local_798,
                           (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFLiteralString>::~RefCountPtr((RefCountPtr<PDFLiteralString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = 0x5c28;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ = 0x31;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ = 0x30;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ = 0x5c31;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ = 0x31;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._7_1_ = 0x30;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._0_2_ = 0x2932;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0xa;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size._2_1_ = 0;
    local_7b8._0_8_ = ppRVar4;
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream(this,(IByteReader *)local_770,pIVar2,false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFLiteralString>::ExpectedResult
              ((ExpectedResult<PDFLiteralString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = 'A';
    local_798.field_2._M_local_buf[1] = 'B';
    local_798._M_string_length = 2;
    local_798.field_2._M_local_buf[2] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    iVar7 = ExpectedResult<PDFLiteralString>::setResult
                      ((ExpectedResult<PDFLiteralString> *)&local_7b8,psVar1,&local_798,
                       (PDFObjectParserTestLogHelper *)&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    ppRVar4 = (RefCountPtr<PDFLiteralString> **)
              &local_7b8.mPathComponents.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    RefCountPtr<PDFLiteralString>::~RefCountPtr((RefCountPtr<PDFLiteralString> *)ppRVar4);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    local_798._M_dataplus._M_p = (pointer)0x10;
    local_7b8._0_8_ = ppRVar4;
    local_7b8._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_7b8,(ulong)&local_798);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._0_2_ = SUB82(local_798._M_dataplus._M_p,0);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._2_1_ =
         (undefined1)((ulong)local_798._M_dataplus._M_p >> 0x10);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._3_1_ =
         (undefined1)((ulong)local_798._M_dataplus._M_p >> 0x18);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._4_2_ =
         (undefined2)((ulong)local_798._M_dataplus._M_p >> 0x20);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._6_1_ =
         (undefined1)((ulong)local_798._M_dataplus._M_p >> 0x30);
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev._7_1_ =
         (undefined1)((ulong)local_798._M_dataplus._M_p >> 0x38);
    ((RefCountPtr<PDFLiteralString> *)local_7b8._0_8_)->_vptr_RefCountPtr =
         (_func_int **)0x37335c3637335c28;
    ((RefCountPtr<PDFLiteralString> *)local_7b8._0_8_)->mValue =
         (PDFLiteralString *)0x293130315c305c37;
    local_7b8.mPathComponents.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_798._M_dataplus._M_p;
    local_798._M_dataplus._M_p
    [(long)&((RefCountPtr<PDFLiteralString> *)local_7b8._0_8_)->_vptr_RefCountPtr] = '\0';
    std::__cxx11::string::_M_assign((string *)psVar1);
    local_740 = (PDFObject *)
                local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    uStack_738 = 0;
    if ((RefCountPtr<PDFLiteralString> **)local_7b8._0_8_ != ppRVar4) {
      operator_delete((void *)local_7b8._0_8_,
                      CONCAT17(local_7b8.mPathComponents.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev._7_1_,
                               CONCAT16(local_7b8.mPathComponents.
                                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev._6_1_,
                                        CONCAT24(local_7b8.mPathComponents.
                                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev.
                                                 _4_2_,CONCAT13(local_7b8.mPathComponents.
                                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _3_1_,CONCAT12(local_7b8.mPathComponents.
                                                                                                                                  
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _2_1_,local_7b8.mPathComponents.
                                                                                                                
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev.
                                                  _0_2_))))) + 1);
    }
    PDFObjectParser::SetReadStream
              (this,(IByteReader *)local_770,(IReadPositionProvider *)(local_770 + 8),false);
    pPVar9 = PDFObjectParser::ParseNewObject(this);
    ExpectedResult<PDFLiteralString>::ExpectedResult
              ((ExpectedResult<PDFLiteralString> *)&local_7b8,pPVar9);
    local_798.field_2._M_local_buf[0] = 'A';
    local_798.field_2._M_local_buf[1] = '\0';
    local_798._M_string_length = (size_type)&DAT_00000001;
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    iVar8 = ExpectedResult<PDFLiteralString>::setResult
                      ((ExpectedResult<PDFLiteralString> *)&local_7b8,psVar1,&local_798,
                       (PDFObjectParserTestLogHelper *)&local_6f0);
    iVar8 = iVar6 + local_778 + local_720 + local_724 + local_728 + local_72c + iVar7 + iVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,
                      CONCAT17(local_798.field_2._M_local_buf[7],
                               CONCAT16(local_798.field_2._M_local_buf[6],
                                        CONCAT15(local_798.field_2._M_local_buf[5],
                                                 CONCAT14(local_798.field_2._M_local_buf[4],
                                                          CONCAT13(local_798.field_2._M_local_buf[3]
                                                                   ,CONCAT12(local_798.field_2.
                                                                             _M_local_buf[2],
                                                                             CONCAT11(local_798.
                                                                                      field_2.
                                                  _M_local_buf[1],local_798.field_2._M_local_buf[0])
                                                  )))))) + 1);
    }
    RefCountPtr<PDFLiteralString>::~RefCountPtr
              ((RefCountPtr<PDFLiteralString> *)
               &local_7b8.mPathComponents.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev);
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_7b8);
    if (0 < iVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Failed tests in PDFObjectParserTest::ParseLiteralStringTokens: ",0x3f);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
    }
    RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_718);
    local_770._0_8_ = &PTR__InputInterfaceToStream_003a5b38;
    local_770._8_8_ = &PTR__InputInterfaceToStream_003a5b70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._16_8_ != &local_750) {
      operator_delete((void *)local_770._16_8_,
                      CONCAT71(local_750._M_allocated_capacity._1_7_,local_750._M_local_buf[0]) + 1)
      ;
    }
    iVar6 = local_774 + (uint)(0 < iVar8);
    if (iVar6 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed tests in PDFObjectParserTest: ",0x25);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
    }
    uVar11 = (uint)(iVar6 != 0);
    PDFParser::~PDFParser(&local_680);
  }
  else {
    uVar11 = 0xffffffff;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to initialize log output\n",0x20);
  }
  OutputFile::~OutputFile(&local_6f0);
  return uVar11;
}

Assistant:

int PDFObjectParserTest(int argc, char* argv[])
{
	int failures = 0;
	PDFObjectParserTestLogHelper log;
	if (log.openLog(BuildRelativeOutputPath(argv, "PDFObjectParserTest.txt")) != eSuccess){
		cout << "failed to initialize log output\n";
		return eFailure;
	}


	PDFParser parser;
	PDFObjectParser*  pObjectParser = &parser.GetObjectParser();

	if (ParseCommentedTokens(pObjectParser,&log) == eFailure){
		++failures;
	}

	if (ParseHexStringTokens(pObjectParser,&log) == eFailure){
		++failures;
	}

	if (ParseLiteralStringTokens(pObjectParser,&log) == eFailure){
		++failures;
	}



	if (failures > 0){
		cout << "Failed tests in PDFObjectParserTest: " << failures << endl;
		return 1;
	}
	return 0;
}